

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O2

void __thiscall
feintrack::SimpleLeftObjectsDetector::NewLeftObject
          (SimpleLeftObjectsDetector *this,uint obj_uid,CObjectRegion *region)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  value_type local_58;
  list<feintrack::CLeftObjView,_std::allocator<feintrack::CLeftObjView>_> *local_40;
  uint local_34;
  
  local_40 = &this->lefted_objects;
  iVar1 = this->left_object_time3;
  iVar2 = this->left_object_time1;
  local_34 = obj_uid;
  iVar3 = CObjectRegion::get_left(region);
  iVar4 = CObjectRegion::get_right(region);
  iVar5 = CObjectRegion::get_top(region);
  local_58.rect.bottom = CObjectRegion::get_bottom(region);
  local_58.obj_uid = local_34;
  local_58.life_time = iVar1 - iVar2;
  local_58.rect.left = iVar3;
  local_58.rect.right = iVar4;
  local_58.rect.top = iVar5;
  std::__cxx11::list<feintrack::CLeftObjView,_std::allocator<feintrack::CLeftObjView>_>::push_back
            (local_40,&local_58);
  return;
}

Assistant:

void SimpleLeftObjectsDetector::NewLeftObject(
        unsigned int obj_uid,
        const CObjectRegion& region
        )
{
    lefted_objects.push_back(CLeftObjView(left_object_time3 - left_object_time1,
                                          region.get_left(), region.get_right(), region.get_top(), region.get_bottom(),
                                          obj_uid));
}